

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall
QPDF::CopiedStreamDataProvider::CopiedStreamDataProvider
          (CopiedStreamDataProvider *this,QPDF *destination_qpdf)

{
  QPDF *destination_qpdf_local;
  CopiedStreamDataProvider *this_local;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,true);
  (this->super_StreamDataProvider)._vptr_StreamDataProvider =
       (_func_int **)&PTR__CopiedStreamDataProvider_0058b708;
  this->destination_qpdf = destination_qpdf;
  std::
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  ::map(&this->foreign_streams);
  std::
  map<QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::shared_ptr<QPDF::ForeignStreamData>_>_>_>
  ::map(&this->foreign_stream_data);
  return;
}

Assistant:

QPDF::CopiedStreamDataProvider::CopiedStreamDataProvider(QPDF& destination_qpdf) :
    QPDFObjectHandle::StreamDataProvider(true),
    destination_qpdf(destination_qpdf)
{
}